

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

void read_num_bytes(char *buf,CVmDataSource *src,size_t len,CVmPackType *t)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  
  iVar2 = (*src->_vptr_CVmDataSource[2])(src,buf);
  if (iVar2 == 0) {
    if (((1 < len) && (t->big_endian != 0)) && (uVar6 = (int)len - 1, 0 < (int)uVar6)) {
      lVar5 = 0;
      uVar4 = (ulong)uVar6;
      do {
        uVar3 = uVar4 - 1;
        cVar1 = buf[lVar5];
        buf[lVar5] = buf[uVar4];
        buf[uVar4] = cVar1;
        lVar5 = lVar5 + 1;
        uVar4 = uVar3;
      } while (lVar5 < (long)uVar3);
    }
    return;
  }
  err_throw(0x65);
}

Assistant:

static void read_num_bytes(char *buf, CVmDataSource *src, size_t len,
                           const CVmPackType *t)
{
    /* read the bytes */
    if (src->read(buf, len))
        err_throw(VMERR_READ_FILE);

    /* 
     *   if the source is in big-endian order, swap the bytes to get our
     *   standard little-endian order 
     */
    if (len > 1 && t->big_endian)
        reverse_bytes(buf, len);
}